

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O3

void M_ParseMenuDefs(void)

{
  TArray<FOptionValues::Pair,_FOptionValues::Pair> *pTVar1;
  undefined8 uVar2;
  EColorRange EVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  FListMenuDescriptor *desc;
  TArray<FOptionValues::Pair,_FOptionValues::Pair> *this;
  Node *pNVar9;
  Node *pNVar10;
  Pair *pPVar11;
  int lastlump;
  FScanner sc;
  FString local_168;
  int local_160;
  int local_15c;
  char *local_158;
  FName local_14c;
  FName local_148;
  FName local_144;
  FName local_140;
  FName local_13c;
  FName local_138;
  FName local_134;
  FScanner local_130;
  
  local_15c = 0;
  local_134.Index = gameinfo.mTitleColor.Index;
  OptionSettings.mTitleColor = V_FindFontColor(&local_134);
  local_138.Index = gameinfo.mFontColor.Index;
  OptionSettings.mFontColor = V_FindFontColor(&local_138);
  local_13c.Index = gameinfo.mFontColorValue.Index;
  OptionSettings.mFontColorValue = V_FindFontColor(&local_13c);
  local_140.Index = gameinfo.mFontColorMore.Index;
  OptionSettings.mFontColorMore = V_FindFontColor(&local_140);
  local_144.Index = gameinfo.mFontColorHeader.Index;
  OptionSettings.mFontColorHeader = V_FindFontColor(&local_144);
  local_148.Index = gameinfo.mFontColorHighlight.Index;
  OptionSettings.mFontColorHighlight = V_FindFontColor(&local_148);
  local_14c.Index = gameinfo.mFontColorSelection.Index;
  OptionSettings.mFontColorSelection = V_FindFontColor(&local_14c);
  DefaultListMenuSettings.mSelectOfsX = 0;
  DefaultListMenuSettings.mSelectOfsY = 0;
  DefaultListMenuSettings.mSelector.texnum = -1;
  DefaultListMenuSettings.mDisplayTop = 0;
  DefaultListMenuSettings.mXpos = 0;
  DefaultListMenuSettings.mYpos = 0;
  DefaultListMenuSettings.mLinespacing = 0;
  FString::operator=(&DefaultListMenuSettings.super_FMenuDescriptor.mNetgameMessage,(char *)"");
  DefaultListMenuSettings.mFont = (FFont *)0x0;
  DefaultListMenuSettings.mFontColor = CR_UNTRANSLATED;
  DefaultListMenuSettings.mFontColor2 = CR_UNTRANSLATED;
  DefaultOptionMenuSettings.mScrollTop = 0;
  DefaultOptionMenuSettings.mIndent = 0;
  DefaultOptionMenuSettings.mPosition = 0;
  DefaultOptionMenuSettings.mDontDim = false;
  addterm(DeinitMenus,"DeinitMenus");
  DeinitMenus();
  local_160 = FWadCollection::CheckNumForName(&Wads,"MENUDEF",0,1,true);
  iVar6 = FWadCollection::FindLump(&Wads,"MENUDEF",&local_15c,false);
  if (iVar6 != -1) {
    local_158 = FString::NullString.Nothing;
    do {
      FScanner::FScanner(&local_130,iVar6);
      mustPrintErrors = local_160 <= iVar6;
      FScanner::SetCMode(&local_130,true);
      while (bVar5 = FScanner::GetString(&local_130), bVar5) {
        bVar5 = FScanner::Compare(&local_130,"LISTMENU");
        if (bVar5) {
          FScanner::MustGetString(&local_130);
          desc = (FListMenuDescriptor *)operator_new(0x88);
          (desc->super_FMenuDescriptor).mMenuName.Index = 0;
          (desc->super_FMenuDescriptor).mNetgameMessage.Chars = local_158;
          FString::NullString.RefCount = FString::NullString.RefCount + 1;
          (desc->super_FMenuDescriptor)._vptr_FMenuDescriptor =
               (_func_int **)&PTR__FListMenuDescriptor_006edd00;
          (desc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array =
               (FListMenuItem **)0x0;
          (desc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Most = 0;
          (desc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count = 0;
          (desc->super_FMenuDescriptor).mType = 0;
          iVar6 = FName::NameManager::FindName(&FName::NameData,local_130.String,false);
          (desc->super_FMenuDescriptor).mMenuName.Index = iVar6;
          desc->mSelectedItem = -1;
          desc->mAutoselect = -1;
          uVar2 = DefaultListMenuSettings._68_8_;
          iVar6 = DefaultListMenuSettings.mSelectOfsY;
          desc->mSelectOfsX = DefaultListMenuSettings.mSelectOfsX;
          uVar4 = DefaultListMenuSettings._68_8_;
          desc->mSelectOfsY = iVar6;
          DefaultListMenuSettings.mSelector.texnum = (int)uVar2;
          DefaultListMenuSettings.mDisplayTop = SUB84(uVar2,4);
          iVar6 = DefaultListMenuSettings.mDisplayTop;
          desc->mSelector = (FTextureID)DefaultListMenuSettings.mSelector.texnum;
          DefaultListMenuSettings._68_8_ = uVar4;
          desc->mDisplayTop = iVar6;
          iVar6 = DefaultListMenuSettings.mYpos;
          desc->mXpos = DefaultListMenuSettings.mXpos;
          desc->mYpos = iVar6;
          desc->mLinespacing = DefaultListMenuSettings.mLinespacing;
          FString::operator=(&(desc->super_FMenuDescriptor).mNetgameMessage,
                             &DefaultListMenuSettings.super_FMenuDescriptor.mNetgameMessage);
          desc->mFont = DefaultListMenuSettings.mFont;
          EVar3 = DefaultListMenuSettings.mFontColor2;
          desc->mFontColor = DefaultListMenuSettings.mFontColor;
          desc->mFontColor2 = EVar3;
          (desc->super_FMenuDescriptor).mClass = (PClass *)0x0;
          desc->mRedirect = (FMenuDescriptor *)0x0;
          desc->mWLeft = 0;
          desc->mWRight = 0;
          desc->mCenter = false;
          ParseListMenuBody(&local_130,desc);
          bVar5 = ReplaceMenu(&local_130,(FMenuDescriptor *)desc);
          if (bVar5) {
LAB_0030dae5:
            (*(desc->super_FMenuDescriptor)._vptr_FMenuDescriptor[1])(desc);
          }
        }
        else {
          bVar5 = FScanner::Compare(&local_130,"DEFAULTLISTMENU");
          if (bVar5) {
            ParseListMenuBody(&local_130,&DefaultListMenuSettings);
            uVar7 = DefaultListMenuSettings.mItems.super_TArray<FListMenuItem_*,_FListMenuItem_*>.
                    Count;
joined_r0x0030df11:
            if (uVar7 != 0) {
              I_FatalError("You cannot add menu items to the menu default settings.");
            }
          }
          else {
            bVar5 = FScanner::Compare(&local_130,"OPTIONVALUE");
            if (bVar5) {
              this = (TArray<FOptionValues::Pair,_FOptionValues::Pair> *)operator_new(0x10);
              this->Array = (Pair *)0x0;
              this->Most = 0;
              this->Count = 0;
              FScanner::MustGetString(&local_130);
              uVar7 = FName::NameManager::FindName(&FName::NameData,local_130.String,false);
              FScanner::MustGetStringName(&local_130,"{");
              bVar5 = FScanner::CheckString(&local_130,"}");
              while (bVar5 == false) {
                uVar8 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::Reserve(this,1);
                pPVar11 = this->Array;
                FScanner::MustGetFloat(&local_130);
                pPVar11[uVar8].Value = local_130.Float;
                FScanner::MustGetStringName(&local_130,",");
                FScanner::MustGetString(&local_130);
                strbin1((char *)&local_168);
                FString::operator=(&pPVar11[uVar8].Text,&local_168);
                FString::~FString(&local_168);
                bVar5 = FScanner::CheckString(&local_130,"}");
              }
              pNVar9 = OptionValues.Nodes + (OptionValues.Size - 1 & uVar7);
              do {
                pNVar10 = pNVar9;
                if ((pNVar10 == (Node *)0x0) || (pNVar10->Next == (Node *)0x1)) goto LAB_0030dd58;
                pNVar9 = pNVar10->Next;
              } while ((pNVar10->Pair).Key.Index != uVar7);
              pTVar1 = &((pNVar10->Pair).Value)->mValues;
              if (pTVar1 != (TArray<FOptionValues::Pair,_FOptionValues::Pair> *)0x0) {
                TArray<FOptionValues::Pair,_FOptionValues::Pair>::~TArray(pTVar1);
                operator_delete(pTVar1,0x10);
              }
LAB_0030dd58:
              local_168.Chars._0_4_ = uVar7;
              pNVar9 = TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>
                       ::GetNode(&OptionValues,(FName *)&local_168);
LAB_0030ddf2:
              (pNVar9->Pair).Value = (FOptionValues *)this;
            }
            else {
              bVar5 = FScanner::Compare(&local_130,"OPTIONSTRING");
              if (bVar5) {
                this = (TArray<FOptionValues::Pair,_FOptionValues::Pair> *)operator_new(0x10);
                this->Array = (Pair *)0x0;
                this->Most = 0;
                this->Count = 0;
                FScanner::MustGetString(&local_130);
                uVar7 = FName::NameManager::FindName(&FName::NameData,local_130.String,false);
                FScanner::MustGetStringName(&local_130,"{");
                bVar5 = FScanner::CheckString(&local_130,"}");
                while (bVar5 == false) {
                  uVar8 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::Reserve(this,1);
                  pPVar11 = this->Array + uVar8;
                  FScanner::MustGetString(&local_130);
                  pPVar11->Value = 1.79769313486232e+308;
                  FString::operator=(&pPVar11->TextValue,local_130.String);
                  FScanner::MustGetStringName(&local_130,",");
                  FScanner::MustGetString(&local_130);
                  strbin1((char *)&local_168);
                  FString::operator=(&pPVar11->Text,&local_168);
                  FString::~FString(&local_168);
                  bVar5 = FScanner::CheckString(&local_130,"}");
                }
                pNVar9 = OptionValues.Nodes + (OptionValues.Size - 1 & uVar7);
                do {
                  pNVar10 = pNVar9;
                  if ((pNVar10 == (Node *)0x0) || (pNVar10->Next == (Node *)0x1)) goto LAB_0030dddf;
                  pNVar9 = pNVar10->Next;
                } while ((pNVar10->Pair).Key.Index != uVar7);
                pTVar1 = &((pNVar10->Pair).Value)->mValues;
                if (pTVar1 != (TArray<FOptionValues::Pair,_FOptionValues::Pair> *)0x0) {
                  TArray<FOptionValues::Pair,_FOptionValues::Pair>::~TArray(pTVar1);
                  operator_delete(pTVar1,0x10);
                }
LAB_0030dddf:
                local_168.Chars._0_4_ = uVar7;
                pNVar9 = TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>
                         ::GetNode(&OptionValues,(FName *)&local_168);
                goto LAB_0030ddf2;
              }
              bVar5 = FScanner::Compare(&local_130,"OPTIONMENUSETTINGS");
              if (bVar5) {
                ParseOptionSettings(&local_130);
              }
              else {
                bVar5 = FScanner::Compare(&local_130,"OPTIONMENU");
                if (bVar5) {
                  FScanner::MustGetString(&local_130);
                  desc = (FListMenuDescriptor *)operator_new(0x60);
                  (desc->super_FMenuDescriptor).mMenuName.Index = 0;
                  (desc->super_FMenuDescriptor).mNetgameMessage.Chars = local_158;
                  (desc->super_FMenuDescriptor)._vptr_FMenuDescriptor =
                       (_func_int **)&PTR__FOptionMenuDescriptor_006edd68;
                  (desc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array =
                       (FListMenuItem **)0x0;
                  (desc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Most = 0;
                  (desc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count = 0;
                  *(char **)&desc->mSelectedItem = local_158;
                  FString::NullString.RefCount = FString::NullString.RefCount + 2;
                  (desc->super_FMenuDescriptor).mType = 1;
                  iVar6 = FName::NameManager::FindName(&FName::NameData,local_130.String,false);
                  (desc->super_FMenuDescriptor).mMenuName.Index = iVar6;
                  desc->mSelectOfsY = -1;
                  desc->mXpos = 0;
                  (desc->super_FMenuDescriptor).mClass = (PClass *)0x0;
                  desc->mDisplayTop = DefaultOptionMenuSettings.mScrollTop;
                  iVar6 = DefaultOptionMenuSettings.mPosition;
                  desc->mYpos = DefaultOptionMenuSettings.mIndent;
                  desc->mWLeft = iVar6;
                  *(bool *)&desc->mWRight = DefaultOptionMenuSettings.mDontDim;
                  ParseOptionMenuBody(&local_130,(FOptionMenuDescriptor *)desc);
                  bVar5 = ReplaceMenu(&local_130,(FMenuDescriptor *)desc);
                  if (desc->mYpos == 0) {
                    FOptionMenuDescriptor::CalcIndent((FOptionMenuDescriptor *)desc);
                  }
                  if (bVar5) goto LAB_0030dae5;
                }
                else {
                  bVar5 = FScanner::Compare(&local_130,"DEFAULTOPTIONMENU");
                  if (bVar5) {
                    ParseOptionMenuBody(&local_130,&DefaultOptionMenuSettings);
                    uVar7 = DefaultOptionMenuSettings.mItems.
                            super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
                    goto joined_r0x0030df11;
                  }
                  FScanner::ScriptError(&local_130,"Unknown keyword \'%s\'",local_130.String);
                }
              }
            }
          }
        }
      }
      FScanner::~FScanner(&local_130);
      iVar6 = FWadCollection::FindLump(&Wads,"MENUDEF",&local_15c,false);
    } while (iVar6 != -1);
  }
  return;
}

Assistant:

void M_ParseMenuDefs()
{
	int lump, lastlump = 0;

	OptionSettings.mTitleColor = V_FindFontColor(gameinfo.mTitleColor);
	OptionSettings.mFontColor = V_FindFontColor(gameinfo.mFontColor);
	OptionSettings.mFontColorValue = V_FindFontColor(gameinfo.mFontColorValue);
	OptionSettings.mFontColorMore = V_FindFontColor(gameinfo.mFontColorMore);
	OptionSettings.mFontColorHeader = V_FindFontColor(gameinfo.mFontColorHeader);
	OptionSettings.mFontColorHighlight = V_FindFontColor(gameinfo.mFontColorHighlight);
	OptionSettings.mFontColorSelection = V_FindFontColor(gameinfo.mFontColorSelection);
	DefaultListMenuSettings.Reset();
	DefaultOptionMenuSettings.Reset();

	atterm(	DeinitMenus);
	DeinitMenus();

	int IWADMenu = Wads.CheckNumForName("MENUDEF", ns_global, FWadCollection::IWAD_FILENUM);

	while ((lump = Wads.FindLump ("MENUDEF", &lastlump)) != -1)
	{
		FScanner sc(lump);

		mustPrintErrors = lump >= IWADMenu;
		sc.SetCMode(true);
		while (sc.GetString())
		{
			if (sc.Compare("LISTMENU"))
			{
				ParseListMenu(sc);
			}
			else if (sc.Compare("DEFAULTLISTMENU"))
			{
				ParseListMenuBody(sc, &DefaultListMenuSettings);
				if (DefaultListMenuSettings.mItems.Size() > 0)
				{
					I_FatalError("You cannot add menu items to the menu default settings.");
				}
			}
			else if (sc.Compare("OPTIONVALUE"))
			{
				ParseOptionValue(sc);
			}
			else if (sc.Compare("OPTIONSTRING"))
			{
				ParseOptionString(sc);
			}
			else if (sc.Compare("OPTIONMENUSETTINGS"))
			{
				ParseOptionSettings(sc);
			}
			else if (sc.Compare("OPTIONMENU"))
			{
				ParseOptionMenu(sc);
			}
			else if (sc.Compare("DEFAULTOPTIONMENU"))
			{
				ParseOptionMenuBody(sc, &DefaultOptionMenuSettings);
				if (DefaultOptionMenuSettings.mItems.Size() > 0)
				{
					I_FatalError("You cannot add menu items to the menu default settings.");
				}
			}
			else
			{
				sc.ScriptError("Unknown keyword '%s'", sc.String);
			}
		}
	}
}